

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate.c
# Opt level: O1

void * dsAlloc(uint64_t length)

{
  ulong uVar1;
  uint64_t offset;
  dsSuperObject *pdVar2;
  bool bVar3;
  dsCrate *crate;
  ulong *puVar4;
  ulong uVar5;
  ulong length_00;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  ulong *puVar9;
  
  pthread_once(&keyOnce,makeKey);
  crate = (dsCrate *)pthread_getspecific(key);
  if (crate == (dsCrate *)0x0) {
    pcVar8 = "%s(): Can\'t get active crate.\n";
  }
  else {
    debugDump(crate);
    uVar1 = length + 0x18;
    uVar6 = 0;
    if (0x3ff < uVar1) {
      uVar6 = 0;
      uVar7 = uVar1;
      do {
        uVar6 = uVar6 + 1;
        bVar3 = 0xfffff < uVar7;
        uVar7 = uVar7 >> 10;
      } while (bVar3);
    }
    puVar4 = (ulong *)0x0;
    dsRunLogCallback("%s(): Group: %d\n","getGroup",(ulong)uVar6);
    if ((int)uVar6 < 8) {
      uVar7 = (ulong)uVar6;
      puVar4 = (ulong *)0x0;
LAB_001029fd:
      offset = crate->super->headGroupOffset[uVar7];
      if (offset == 0xffffffffffffffff) goto code_r0x00102a08;
      puVar4 = (ulong *)mapObject(crate,offset,0x10);
      if (puVar4 == (ulong *)0x0) {
        length_00 = 0x10;
LAB_00102a63:
        puVar4 = (ulong *)0x0;
        dsRunLogCallback("%s(): Can\'t mapObject(,%lu,%lu)\n","allocateObject",offset,length_00);
      }
      else {
        if (-1 < (long)*puVar4) {
          pcVar8 = "%s(): Object should be free but isn\'t.\n";
          goto LAB_00102bb6;
        }
        length_00 = *puVar4 & 0x3fffffffffffffff;
        uVar5 = length_00 - uVar1;
        if (length_00 < uVar1) {
          pcVar8 = "%s(): Object groups are corrupt!\n";
          goto LAB_00102bb6;
        }
        if (crate->super->headGroupOffset[uVar7] != offset) {
          dsRunLogCallback("%s(): Free object isn\'t head of group.\n","unlinkFromGroup");
          pcVar8 = "%s(): Can\'t unlink free object.\n";
          goto LAB_00102bb6;
        }
        crate->super->headGroupOffset[uVar7] = puVar4[1];
        puVar4[1] = 0xffffffffffffffff;
        puVar4 = (ulong *)mapObject(crate,offset,length_00);
        if (puVar4 == (ulong *)0x0) goto LAB_00102a63;
        if (length_00 < length + 0x31) goto LAB_00102c32;
        puVar9 = (ulong *)((long)puVar4 + uVar1);
        *(ulong *)(uVar1 + (long)puVar4) = uVar5 | 0x8000000000000000;
        *(undefined8 *)(length + 0x20 + (long)puVar4) = 0xffffffffffffffff;
        *(uint64_t *)(((uVar5 & 0x3fffffffffffffff) - 8) + (long)puVar9) = offset + uVar1;
        if ((*puVar4 & 0x4000000000000000) != 0) {
          *puVar9 = *puVar9 | 0x4000000000000000;
        }
        uVar6 = 0;
        if (0x3ff < uVar5) {
          uVar6 = 0;
          do {
            uVar6 = uVar6 + 1;
            bVar3 = 0xfffff < uVar5;
            uVar5 = uVar5 >> 10;
          } while (bVar3);
        }
        dsRunLogCallback("%s(): Group: %d\n","getGroup",(ulong)uVar6);
        if ((int)uVar6 < 8) {
          pdVar2 = crate->super;
          puVar9[1] = pdVar2->headGroupOffset[(int)uVar6];
          pdVar2->headGroupOffset[(int)uVar6] = offset + uVar1;
          length_00 = uVar1;
LAB_00102c32:
          *puVar4 = length_00;
          puVar4[1] = 0xffffffffffffffff;
          *(uint64_t *)((long)puVar4 + ((length_00 & 0x3fffffffffffffff) - 8)) = offset;
          debugDump(crate);
          goto LAB_00102bc6;
        }
        dsRunLogCallback("%s(): Group does not exist.\n","linkToGroup");
        pcVar8 = "%s(): Can\'t link free object.\n";
LAB_00102bb6:
        puVar4 = (ulong *)0x0;
        dsRunLogCallback(pcVar8,"allocateObject");
      }
    }
LAB_00102bc6:
    if (puVar4 != (ulong *)0x0) {
      return puVar4 + 2;
    }
    pcVar8 = "%s(): Can\'t allocate object.\n";
  }
  dsRunLogCallback(pcVar8,"dsAlloc");
  return (void *)0x0;
code_r0x00102a08:
  uVar7 = uVar7 + 1;
  if (uVar7 == 8) goto LAB_00102bc6;
  goto LAB_001029fd;
}

Assistant:

void *
dsAlloc(uint64_t length)
{
	dsCrate *crate;
	void *memory;

	if ((crate = getActiveCrate()) == NULL) {
		dsLog("Can't get active crate.\n");
		return NULL;
	}

	if ((memory = allocateObject(crate, length)) == NULL) {
		dsLog("Can't allocate object.\n");
		return NULL;
	}

	memory += sizeof(dsObject);

	return memory;
}